

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::ConsoleReporter::printRegisteredReporters(ConsoleReporter *this)

{
  anon_class_8_1_8991fb9c printReporters;
  char *in_stack_00000020;
  reporterMap *in_stack_00000028;
  anon_class_8_1_8991fb9c *in_stack_00000030;
  ConsoleReporter *in_stack_fffffffffffffff0;
  
  printVersion(in_stack_fffffffffffffff0);
  getListeners();
  printRegisteredReporters::anon_class_8_1_8991fb9c::operator()
            (in_stack_00000030,in_stack_00000028,in_stack_00000020);
  getReporters();
  printRegisteredReporters::anon_class_8_1_8991fb9c::operator()
            (in_stack_00000030,in_stack_00000028,in_stack_00000020);
  return;
}

Assistant:

void printRegisteredReporters() {
            printVersion();
            auto printReporters = [this] (const reporterMap& reporters, const char* type) {
                if(reporters.size()) {
                    s << Color::Cyan << "[doctest] " << Color::None << "listing all registered " << type << "\n";
                    for(auto& curr : reporters)
                        s << "priority: " << std::setw(5) << curr.first.first
                          << " name: " << curr.first.second << "\n";
                }
            };
            printReporters(getListeners(), "listeners");
            printReporters(getReporters(), "reporters");
        }